

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O3

bool __thiscall FMultiPatchTexture::UseBasePalette(FMultiPatchTexture *this)

{
  char cVar1;
  long lVar2;
  long lVar3;
  
  if (((this->super_FTexture).field_0x32 & 1) != 0) {
    return false;
  }
  if (this->NumParts < 1) {
    cVar1 = '\x01';
  }
  else {
    lVar2 = 0x18;
    lVar3 = 0;
    do {
      cVar1 = (**(code **)(**(long **)((long)&this->Parts->OriginX + lVar2) + 0x28))();
      if (cVar1 == '\0') {
        return false;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x28;
    } while (lVar3 < this->NumParts);
  }
  return (bool)cVar1;
}

Assistant:

bool FMultiPatchTexture::UseBasePalette() 
{ 
	if (bComplex) return false;
	for(int i=0;i<NumParts;i++)
	{
		if (!Parts[i].Texture->UseBasePalette()) return false;
	}
	return true;
}